

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopt-errors.c
# Opt level: O1

void gopt_errors(char *argv0,option *options)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  
  uVar2 = 0xffffffff;
  do {
    uVar1 = (int)uVar2 + 1;
    uVar2 = (ulong)uVar1;
  } while ((options[uVar2].flags & 0x100) == 0);
  iVar5 = (int)options[uVar2].short_name;
  if (iVar5 == 0) {
    pcVar3 = options[uVar2].long_name;
    if (pcVar3 != (char *)0x0) {
      pcVar4 = "%s: unrecognised option --%s\n";
LAB_00102f04:
      __fprintf_chk(_stderr,1,pcVar4,argv0,pcVar3);
      goto LAB_00102f37;
    }
    while( true ) {
      if (uVar1 == 0) {
        return;
      }
      uVar1 = ~options->flags;
      if ((uVar1 & 0x12) == 0) break;
      if ((uVar1 & 0x21) == 0) {
        iVar5 = (int)options->short_name;
        pcVar3 = "%s: option -%c must not have an option-argument\n";
        goto LAB_00102eca;
      }
      if ((uVar1 & 0x42) == 0) {
        pcVar3 = options->long_name;
        pcVar4 = "%s: option --%s requires an option-argument\n";
        goto LAB_00102f04;
      }
      if ((uVar1 & 0x81) == 0) {
        pcVar3 = options->long_name;
        pcVar4 = "%s: option --%s must not have an option-argument\n";
        goto LAB_00102f04;
      }
      if (((options->flags & 8) == 0) && (1 < options->count)) {
        __fprintf_chk(_stderr,1,"%s: option -%c/--%s may not be repeated\n",argv0,
                      (int)options->short_name,options->long_name);
        goto LAB_00102f37;
      }
      options = options + 1;
      uVar1 = (int)uVar2 - 1;
      uVar2 = (ulong)uVar1;
    }
    iVar5 = (int)options->short_name;
    pcVar3 = "%s: option -%c requires an option-argument\n";
  }
  else {
    pcVar3 = "%s: unrecognised option -%c\n";
  }
LAB_00102eca:
  __fprintf_chk(_stderr,1,pcVar3,argv0,iVar5);
LAB_00102f37:
  exit(1);
}

Assistant:

void gopt_errors (const char *argv0, const struct option *options)
{
  unsigned int bad_option_index = 0;
  unsigned int i;

  while (!(options[bad_option_index].flags & GOPT_LAST))
  {
    bad_option_index++;
  }

  if (options[bad_option_index].short_name)
  {
    fprintf (stderr, "%s: unrecognised option -%c\n", argv0, options[bad_option_index].short_name);
    exit (EX_USAGE);
  }

  if (options[bad_option_index].long_name)
  {
    fprintf (stderr, "%s: unrecognised option --%s\n", argv0, options[bad_option_index].long_name);
    exit (EX_USAGE);
  }

  for (i = 0; i < bad_option_index; i++)
  {
    if ((options[i].flags & GOPT_SEEN_SHORT_WITHOUT) && (options[i].flags & GOPT_ARGUMENT_REQUIRED))
    {
      fprintf (stderr, "%s: option -%c requires an option-argument\n", argv0, options[i].short_name);
      exit (EX_USAGE);
    }

    if ((options[i].flags & GOPT_SEEN_SHORT_WITH) && (options[i].flags & GOPT_ARGUMENT_FORBIDDEN))
    {
      fprintf (stderr, "%s: option -%c must not have an option-argument\n", argv0, options[i].short_name);
      exit (EX_USAGE);
    }

    if ((options[i].flags & GOPT_SEEN_LONG_WITHOUT) && (options[i].flags & GOPT_ARGUMENT_REQUIRED))
    {
      fprintf (stderr, "%s: option --%s requires an option-argument\n", argv0, options[i].long_name);
      exit (EX_USAGE);
    }

    if ((options[i].flags & GOPT_SEEN_LONG_WITH) && (options[i].flags & GOPT_ARGUMENT_FORBIDDEN))
    {
      fprintf (stderr, "%s: option --%s must not have an option-argument\n", argv0, options[i].long_name);
      exit (EX_USAGE);
    }

    if ((options[i].count > 1) && !(options[i].flags & GOPT_REPEATABLE))
    {
      fprintf (stderr, "%s: option -%c/--%s may not be repeated\n", argv0, options[i].short_name, options[i].long_name);
      exit (EX_USAGE);
    }
  }
}